

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

bool32 rw::ps2::unfixDmaOffsets(InstanceData *inst)

{
  uint *puVar1;
  uint uVar2;
  bool32 bVar3;
  
  puVar1 = (uint *)inst->data;
  bVar3 = 1;
  while( true ) {
    while( true ) {
      uVar2 = *puVar1 & 0x70000000;
      if (uVar2 != 0x10000000) break;
      puVar1 = (uint *)((long)puVar1 + (ulong)((*puVar1 & 0xffff) << 4) + 0x10);
    }
    if (uVar2 != 0x30000000) break;
    puVar1 = puVar1 + 4;
    bVar3 = 0;
  }
  if (uVar2 != 0x60000000) {
    fprintf(_stderr,"error: unknown DMAtag %X\n");
  }
  return bVar3;
}

Assistant:

bool32
unfixDmaOffsets(InstanceData *inst)
{
	bool32 norefs = 1;
#ifdef RW_PS2
	uint32 base = (uint32)inst->data;
#endif
	uint32 *tag = (uint32*)inst->data;
	for(;;){
		switch(tag[0]&0x70000000){
		// DMAcnt
		case 0x10000000:
			// no need to unfix
			tag += (1+(tag[0]&0xFFFF))*4;
			break;

		// DMAref
		case 0x30000000:
			norefs = 0;
			// unfix address and jump to next
#ifdef RW_PS2
			tag[1] = (tag[1] - base)>>4;
#endif
			tag += 4;
			break;

		// DMAret
		case 0x60000000:
			return norefs;

		default:
			fprintf(stderr, "error: unknown DMAtag %X\n", tag[0]);
			return norefs;
		}
	}
}